

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionRequestReliablePdu.cpp
# Opt level: O0

int __thiscall DIS::ActionRequestReliablePdu::getMarshalledSize(ActionRequestReliablePdu *this)

{
  pointer pEVar1;
  undefined8 uVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  pointer pEVar6;
  const_reference pvVar7;
  undefined1 local_78 [8];
  VariableDatum listElement_1;
  unsigned_long_long idx_1;
  undefined1 local_30 [8];
  FixedDatum listElement;
  unsigned_long_long idx;
  int marshalSize;
  ActionRequestReliablePdu *this_local;
  
  iVar3 = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  idx._4_4_ = iVar3 + 0x14;
  listElement._fixedDatumID = 0;
  listElement._fixedDatumValue = 0;
  while( true ) {
    uVar2 = listElement._8_8_;
    sVar4 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size
                      (&this->_fixedDatumRecords);
    if (sVar4 <= (ulong)uVar2) break;
    pvVar5 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::operator[]
                       (&this->_fixedDatumRecords,listElement._8_8_);
    FixedDatum::FixedDatum((FixedDatum *)local_30,pvVar5);
    iVar3 = FixedDatum::getMarshalledSize((FixedDatum *)local_30);
    idx._4_4_ = idx._4_4_ + iVar3;
    FixedDatum::~FixedDatum((FixedDatum *)local_30);
    listElement._8_8_ = listElement._8_8_ + 1;
  }
  listElement_1._variableDatums.
  super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    pEVar1 = listElement_1._variableDatums.
             super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pEVar6 = (pointer)std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                                (&this->_variableDatumRecords);
    if (pEVar6 <= pEVar1) break;
    pvVar7 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                       (&this->_variableDatumRecords,
                        (size_type)
                        listElement_1._variableDatums.
                        super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    VariableDatum::VariableDatum((VariableDatum *)local_78,pvVar7);
    iVar3 = VariableDatum::getMarshalledSize((VariableDatum *)local_78);
    idx._4_4_ = idx._4_4_ + iVar3;
    VariableDatum::~VariableDatum((VariableDatum *)local_78);
    listElement_1._variableDatums.
    super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(listElement_1._variableDatums.
                           super__Vector_base<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_EightByteChunk
                  + 1);
  }
  return idx._4_4_;
}

Assistant:

int ActionRequestReliablePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 1;  // _requiredReliabilityService
   marshalSize = marshalSize + 2;  // _pad1
   marshalSize = marshalSize + 1;  // _pad2
   marshalSize = marshalSize + 4;  // _requestID
   marshalSize = marshalSize + 4;  // _actionID
   marshalSize = marshalSize + 4;  // _numberOfFixedDatumRecords
   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _fixedDatumRecords.size(); idx++)
   {
        FixedDatum listElement = _fixedDatumRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatumRecords.size(); idx++)
   {
        VariableDatum listElement = _variableDatumRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}